

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx.cpp
# Opt level: O3

void __thiscall
ncnn::quantize(ncnn *this,float *ptr,char *s8ptr,Mat *scale_data,int elemcount,int elempack)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int scale_data_size;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  float fVar9;
  float fVar14;
  float fVar15;
  undefined1 auVar10 [16];
  float fVar16;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar41 [64];
  undefined1 auVar13 [28];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar40 [32];
  
  uVar6 = elemcount * elempack;
  fVar1 = *(float *)s8ptr;
  auVar10._4_4_ = fVar1;
  auVar10._0_4_ = fVar1;
  auVar10._8_4_ = fVar1;
  auVar10._12_4_ = fVar1;
  auVar13._16_4_ = fVar1;
  auVar13._0_16_ = auVar10;
  auVar13._20_4_ = fVar1;
  auVar13._24_4_ = fVar1;
  if (1 < (int)scale_data) {
    if (elempack == 4) {
      auVar10 = *(undefined1 (*) [16])s8ptr;
      auVar8._16_16_ = auVar10;
      auVar8._0_16_ = auVar10;
      auVar13 = auVar8._0_28_;
    }
    else if (elempack == 8) {
      auVar13 = SUB3228(*(undefined1 (*) [32])s8ptr,0);
    }
  }
  uVar2 = 0;
  fVar9 = auVar13._0_4_;
  fVar14 = auVar13._4_4_;
  fVar15 = auVar13._8_4_;
  fVar16 = auVar13._12_4_;
  fVar17 = auVar13._16_4_;
  fVar18 = auVar13._20_4_;
  fVar19 = auVar13._24_4_;
  if (0xf < (int)uVar6) {
    uVar2 = uVar6 & 0x7ffffff0;
    iVar5 = 0xf;
    auVar21._8_4_ = 0x80000000;
    auVar21._0_8_ = 0x8000000080000000;
    auVar21._12_4_ = 0x80000000;
    auVar21._16_4_ = 0x80000000;
    auVar21._20_4_ = 0x80000000;
    auVar21._24_4_ = 0x80000000;
    auVar21._28_4_ = 0x80000000;
    auVar24._8_4_ = 0x3f000000;
    auVar24._0_8_ = 0x3f0000003f000000;
    auVar24._12_4_ = 0x3f000000;
    auVar24._16_4_ = 0x3f000000;
    auVar24._20_4_ = 0x3f000000;
    auVar24._24_4_ = 0x3f000000;
    auVar24._28_4_ = 0x3f000000;
    auVar26._8_4_ = 0x7f007f;
    auVar26._0_8_ = 0x7f007f007f007f;
    auVar26._12_4_ = 0x7f007f;
    auVar29._8_4_ = 0xff81ff81;
    auVar29._0_8_ = 0xff81ff81ff81ff81;
    auVar29._12_4_ = 0xff81ff81;
    do {
      auVar37._0_4_ = fVar9 * *(float *)this;
      auVar37._4_4_ = fVar14 * *(float *)(this + 4);
      auVar37._8_4_ = fVar15 * *(float *)(this + 8);
      auVar37._12_4_ = fVar16 * *(float *)(this + 0xc);
      auVar37._16_4_ = fVar17 * *(float *)(this + 0x10);
      auVar37._20_4_ = fVar18 * *(float *)(this + 0x14);
      auVar37._28_36_ = in_ZMM7._28_36_;
      auVar37._24_4_ = fVar19 * *(float *)(this + 0x18);
      auVar41._0_4_ = fVar9 * *(float *)(this + 0x20);
      auVar41._4_4_ = fVar14 * *(float *)(this + 0x24);
      auVar41._8_4_ = fVar15 * *(float *)(this + 0x28);
      auVar41._12_4_ = fVar16 * *(float *)(this + 0x2c);
      auVar41._16_4_ = fVar17 * *(float *)(this + 0x30);
      auVar41._20_4_ = fVar18 * *(float *)(this + 0x34);
      auVar41._28_36_ = in_ZMM8._28_36_;
      auVar41._24_4_ = fVar19 * *(float *)(this + 0x38);
      auVar8 = vandps_avx(auVar37._0_32_,auVar21);
      auVar22 = vandps_avx(auVar41._0_32_,auVar21);
      auVar8 = vorps_avx(auVar8,auVar24);
      auVar22 = vorps_avx(auVar22,auVar24);
      auVar33._0_4_ = (int)(auVar8._0_4_ + auVar37._0_4_);
      auVar33._4_4_ = (int)(auVar8._4_4_ + auVar37._4_4_);
      auVar33._8_4_ = (int)(auVar8._8_4_ + auVar37._8_4_);
      auVar33._12_4_ = (int)(auVar8._12_4_ + auVar37._12_4_);
      auVar35._16_4_ = (int)(auVar8._16_4_ + auVar37._16_4_);
      auVar35._0_16_ = auVar33;
      auVar35._20_4_ = (int)(auVar8._20_4_ + auVar37._20_4_);
      auVar35._24_4_ = (int)(auVar8._24_4_ + auVar37._24_4_);
      auVar35._28_4_ = (int)(auVar8._28_4_ + in_ZMM7._28_4_);
      auVar39._0_4_ = (int)(auVar41._0_4_ + auVar22._0_4_);
      auVar39._4_4_ = (int)(auVar41._4_4_ + auVar22._4_4_);
      auVar39._8_4_ = (int)(auVar41._8_4_ + auVar22._8_4_);
      auVar39._12_4_ = (int)(auVar41._12_4_ + auVar22._12_4_);
      auVar40._16_4_ = (int)(auVar41._16_4_ + auVar22._16_4_);
      auVar40._0_16_ = auVar39;
      auVar40._20_4_ = (int)(auVar41._20_4_ + auVar22._20_4_);
      auVar40._24_4_ = (int)(auVar41._24_4_ + auVar22._24_4_);
      auVar40._28_4_ = (int)(in_ZMM8._28_4_ + auVar22._28_4_);
      auVar33 = vpackssdw_avx(auVar33,auVar35._16_16_);
      auVar39 = vpackssdw_avx(auVar39,auVar40._16_16_);
      auVar33 = vpminsw_avx(auVar33,auVar26);
      auVar39 = vpminsw_avx(auVar39,auVar26);
      auVar33 = vpmaxsw_avx(auVar33,auVar29);
      auVar39 = vpmaxsw_avx(auVar39,auVar29);
      in_ZMM8 = ZEXT1664(auVar39);
      auVar33 = vpacksswb_avx(auVar33,auVar39);
      in_ZMM7 = ZEXT1664(auVar33);
      *(undefined1 (*) [16])ptr = auVar33;
      this = this + 0x40;
      ptr = (float *)((long)ptr + 0x10);
      iVar5 = iVar5 + 0x10;
    } while (iVar5 < (int)uVar6);
  }
  if ((int)(uVar2 | 7) < (int)uVar6) {
    auVar22._8_4_ = 0x80000000;
    auVar22._0_8_ = 0x8000000080000000;
    auVar22._12_4_ = 0x80000000;
    auVar22._16_4_ = 0x80000000;
    auVar22._20_4_ = 0x80000000;
    auVar22._24_4_ = 0x80000000;
    auVar22._28_4_ = 0x80000000;
    auVar25._8_4_ = 0x3f000000;
    auVar25._0_8_ = 0x3f0000003f000000;
    auVar25._12_4_ = 0x3f000000;
    auVar25._16_4_ = 0x3f000000;
    auVar25._20_4_ = 0x3f000000;
    auVar25._24_4_ = 0x3f000000;
    auVar25._28_4_ = 0x3f000000;
    auVar27._8_4_ = 0x7f007f;
    auVar27._0_8_ = 0x7f007f007f007f;
    auVar27._12_4_ = 0x7f007f;
    auVar30._8_4_ = 0xff81ff81;
    auVar30._0_8_ = 0xff81ff81ff81ff81;
    auVar30._12_4_ = 0xff81ff81;
    uVar3 = uVar2;
    do {
      auVar38._0_4_ = fVar9 * *(float *)this;
      auVar38._4_4_ = fVar14 * *(float *)(this + 4);
      auVar38._8_4_ = fVar15 * *(float *)(this + 8);
      auVar38._12_4_ = fVar16 * *(float *)(this + 0xc);
      auVar38._16_4_ = fVar17 * *(float *)(this + 0x10);
      auVar38._20_4_ = fVar18 * *(float *)(this + 0x14);
      auVar38._28_36_ = in_ZMM7._28_36_;
      auVar38._24_4_ = fVar19 * *(float *)(this + 0x18);
      auVar8 = vandps_avx(auVar38._0_32_,auVar22);
      auVar8 = vorps_avx(auVar8,auVar25);
      auVar34._0_4_ = (int)(auVar8._0_4_ + auVar38._0_4_);
      auVar34._4_4_ = (int)(auVar8._4_4_ + auVar38._4_4_);
      auVar34._8_4_ = (int)(auVar8._8_4_ + auVar38._8_4_);
      auVar34._12_4_ = (int)(auVar8._12_4_ + auVar38._12_4_);
      auVar36._16_4_ = (int)(auVar8._16_4_ + auVar38._16_4_);
      auVar36._0_16_ = auVar34;
      auVar36._20_4_ = (int)(auVar8._20_4_ + auVar38._20_4_);
      auVar36._24_4_ = (int)(auVar8._24_4_ + auVar38._24_4_);
      auVar36._28_4_ = (int)(auVar8._28_4_ + in_ZMM7._28_4_);
      auVar26 = vpackssdw_avx(auVar34,auVar36._16_16_);
      auVar26 = vpminsw_avx(auVar26,auVar27);
      auVar26 = vpmaxsw_avx(auVar26,auVar30);
      auVar26 = vpacksswb_avx(auVar26,auVar26);
      in_ZMM7 = ZEXT1664(auVar26);
      *(long *)*(undefined1 (*) [16])ptr = auVar26._0_8_;
      this = this + 0x20;
      ptr = (float *)(*(undefined1 (*) [16])ptr + 8);
      uVar2 = uVar3 + 8;
      iVar5 = uVar3 + 0xf;
      uVar3 = uVar2;
    } while (iVar5 < (int)uVar6);
  }
  if ((int)(uVar2 | 3) < (int)uVar6) {
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar20._8_4_ = 0x3f000000;
    auVar20._0_8_ = 0x3f0000003f000000;
    auVar20._12_4_ = 0x3f000000;
    auVar23._8_4_ = 0x7f007f;
    auVar23._0_8_ = 0x7f007f007f007f;
    auVar23._12_4_ = 0x7f007f;
    auVar28._8_4_ = 0xff81ff81;
    auVar28._0_8_ = 0xff81ff81ff81ff81;
    auVar28._12_4_ = 0xff81ff81;
    uVar3 = uVar2;
    do {
      auVar31._0_4_ = auVar10._0_4_ * *(float *)this;
      auVar31._4_4_ = auVar10._4_4_ * *(float *)(this + 4);
      auVar31._8_4_ = auVar10._8_4_ * *(float *)(this + 8);
      auVar31._12_4_ = auVar10._12_4_ * *(float *)(this + 0xc);
      auVar26 = vandps_avx(auVar31,auVar11);
      auVar26 = vorps_avx(auVar26,auVar20);
      auVar32._0_4_ = (int)(auVar31._0_4_ + auVar26._0_4_);
      auVar32._4_4_ = (int)(auVar31._4_4_ + auVar26._4_4_);
      auVar32._8_4_ = (int)(auVar31._8_4_ + auVar26._8_4_);
      auVar32._12_4_ = (int)(auVar31._12_4_ + auVar26._12_4_);
      auVar26 = vpackssdw_avx(auVar32,auVar32);
      auVar26 = vpminsw_avx(auVar26,auVar23);
      auVar26 = vpmaxsw_avx(auVar26,auVar28);
      auVar26 = vpacksswb_avx(auVar26,auVar26);
      *(int *)*(undefined1 (*) [16])ptr = auVar26._0_4_;
      this = this + 0x10;
      ptr = (float *)(*(undefined1 (*) [16])ptr + 4);
      uVar2 = uVar3 + 4;
      iVar5 = uVar3 + 7;
      uVar3 = uVar2;
    } while (iVar5 < (int)uVar6);
  }
  if (uVar6 - uVar2 != 0 && (int)uVar2 <= (int)uVar6) {
    lVar4 = 0;
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar12._8_4_ = 0x3effffff;
    auVar12._0_8_ = 0x3effffff3effffff;
    auVar12._12_4_ = 0x3effffff;
    do {
      auVar10 = vandps_avx(ZEXT416((uint)(fVar1 * *(float *)(this + lVar4 * 4))),auVar7);
      auVar10 = vorps_avx(auVar10,auVar12);
      auVar10 = ZEXT416((uint)(fVar1 * *(float *)(this + lVar4 * 4) + auVar10._0_4_));
      auVar10 = vroundss_avx(auVar10,auVar10,0xb);
      iVar5 = (int)auVar10._0_4_;
      if (iVar5 < -0x7e) {
        iVar5 = -0x7f;
      }
      if (0x7e < iVar5) {
        iVar5 = 0x7f;
      }
      (*(undefined1 (*) [16])ptr)[lVar4] = (char)iVar5;
      lVar4 = lVar4 + 1;
    } while (uVar6 - uVar2 != (int)lVar4);
  }
  return;
}

Assistant:

static void quantize(const float* ptr, signed char* s8ptr, const Mat& scale_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("quantize %d   %d %d", scale_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    int i = 0;
#if __SSE2__
#if __AVX__
    for (; i + 15 < size; i += 16)
    {
#if __AVX512F__
        __m512 _v = _mm512_loadu_ps(ptr);
        _v = _mm512_mul_ps(_v, _scale_avx512);
        _mm_storeu_si128((__m128i*)s8ptr, float2int8_avx512(_v));
#else  // __AVX512F__
        __m256 _v0 = _mm256_loadu_ps(ptr);
        __m256 _v1 = _mm256_loadu_ps(ptr + 8);
        _v0 = _mm256_mul_ps(_v0, _scale_avx);
        _v1 = _mm256_mul_ps(_v1, _scale_avx);
        _mm_storeu_si128((__m128i*)s8ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
        ptr += 16;
        s8ptr += 16;
    }
#endif // __AVX__
    for (; i + 7 < size; i += 8)
    {
#if __AVX__
        __m256 _v = _mm256_loadu_ps(ptr);
        _v = _mm256_mul_ps(_v, _scale_avx);
        *(int64_t*)s8ptr = float2int8_avx(_v);
#else  // __AVX__
        __m128 _v0 = _mm_loadu_ps(ptr);
        __m128 _v1 = _mm_loadu_ps(ptr + 4);
        _v0 = _mm_mul_ps(_v0, _scale);
        _v1 = _mm_mul_ps(_v1, _scale);
        *(int64_t*)s8ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
        ptr += 8;
        s8ptr += 8;
    }
    for (; i + 3 < size; i += 4)
    {
        __m128 _v = _mm_loadu_ps(ptr);
        _v = _mm_mul_ps(_v, _scale);
        int32_t v = float2int8_sse(_v);
        s8ptr[0] = (v >> 0) & 0xff;
        s8ptr[1] = (v >> 8) & 0xff;
        s8ptr[2] = (v >> 16) & 0xff;
        s8ptr[3] = (v >> 24) & 0xff;
        ptr += 4;
        s8ptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        float v = *ptr * scale;
        *s8ptr = float2int8(v);
        ptr++;
        s8ptr++;
    }
}